

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

BlindFactor *
cfd::core::ConfidentialTransaction::CalculateAssetEntropy
          (BlindFactor *__return_storage_ptr__,Txid *txid,uint32_t vout,ByteData256 *contract_hash)

{
  CfdException *this;
  allocator local_8d;
  int ret;
  undefined1 local_88 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  Txid::GetData((ByteData *)local_88,txid);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
                     (ByteData *)local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,contract_hash);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entropy,0x20,
             (allocator_type *)local_88);
  ret = wally_tx_elements_issuance_generate_entropy
                  (local_38._M_impl.super__Vector_impl_data._M_start,
                   (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_38._M_impl.super__Vector_impl_data._M_start,vout,
                   local_50._M_impl.super__Vector_impl_data._M_start,
                   (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_50._M_impl.super__Vector_impl_data._M_start,
                   entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   (long)entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData256::ByteData256((ByteData256 *)local_88,&entropy);
    BlindFactor::BlindFactor(__return_storage_ptr__,(ByteData256 *)local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    return __return_storage_ptr__;
  }
  local_88._0_8_ = "cfdcore_elements_transaction.cpp";
  local_88._8_4_ = 0x81d;
  local_88._16_8_ = "CalculateAssetEntropy";
  logger::warn<int&>((CfdSourceLocation *)local_88,
                     "wally_tx_elements_issuance_generate_entropy NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_88,"entropy generate error.",&local_8d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlindFactor ConfidentialTransaction::CalculateAssetEntropy(
    const Txid &txid, const uint32_t vout, const ByteData256 &contract_hash) {
  const std::vector<uint8_t> &txid_byte = txid.GetData().GetBytes();
  const std::vector<uint8_t> &contract_hash_byte = contract_hash.GetBytes();
  std::vector<uint8_t> entropy(kEntropySize);

  int ret = wally_tx_elements_issuance_generate_entropy(
      txid_byte.data(), txid_byte.size(), vout, contract_hash_byte.data(),
      contract_hash_byte.size(), entropy.data(), entropy.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_generate_entropy NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "entropy generate error.");
  }

  return BlindFactor(ByteData256(entropy));
}